

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzDD::ArchiveOUT(ChNodeFEAxyzDD *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChNodeFEAxyzDD *)(this[-1].DD_dtdt.m_data + 2),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzDD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzDD>();
    // serialize parent class
    ChNodeFEAxyzD::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(DD);
    marchive << CHNVP(DD_dt);
    marchive << CHNVP(DD_dtdt);
}